

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_dataset.cpp
# Opt level: O2

void trimesh::
     assign_pairs2<1,boost::iterators::counting_iterator<int,boost::use_default,boost::use_default>>
               (dataset_t *ds,counting_iterator<int,_boost::use_default,_boost::use_default> *b,
               counting_iterator<int,_boost::use_default,_boost::use_default> *e)

{
  _Iter_comp_iter<boost::_bi::bind_t<bool,_boost::_mfi::cmf2<bool,_trimesh::dataset_t,_const_int_&,_const_int_&>,_boost::_bi::list3<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>,_boost::arg<2>_>_>_>
  __comp;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  cellid_t *__last;
  int *piVar4;
  ostream *poVar5;
  runtime_error *this;
  int c;
  string local_228 [32];
  cellid_t cf [20];
  stringstream ss;
  dataset_t *local_1a8 [47];
  
  c = (b->super_type).m_iterator;
  do {
    if (c == (e->super_type).m_iterator) {
      return;
    }
    if ((ds->m_cell_pairs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[c] == invalid_cellid) {
      uVar3 = dataset_t::get_cets<(trimesh::eGDIR)1>(ds,c,cf);
      if (0x13 < uVar3) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar5 = std::operator<<((ostream *)local_1a8,"Failed to ensure condition ");
        poVar5 = std::operator<<(poVar5,"pos < size");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"at (");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_dataset.cpp"
                                );
        poVar5 = std::operator<<(poVar5,",");
        poVar5 = std::operator<<(poVar5,"assign_pairs2");
        poVar5 = std::operator<<(poVar5,",");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x6e);
        poVar5 = std::operator<<(poVar5,") \n ");
        std::operator<<(poVar5,"A maximum of 20 cofacets are assumed. Adjust const above!!");
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(this,local_228);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      __last = filter_elst2(cf,cf + uVar3,cf,(b->super_type).m_iterator,ds);
      _ss = dataset_t::compare_cells<2>;
      __comp._M_comp.l_.
      super_storage3<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>,_boost::arg<2>_>.
      super_storage2<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>_>.
      super_storage1<boost::_bi::value<trimesh::dataset_t_*>_>.a1_.t_ =
           (storage3<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>,_boost::arg<2>_>)
           (storage3<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>,_boost::arg<2>_>)ds;
      __comp._M_comp.f_ =
           (cmf2<bool,_trimesh::dataset_t,_const_int_&,_const_int_&>)ZEXT816(0x170586);
      local_1a8[0] = ds;
      piVar4 = std::
               __min_element<int*,__gnu_cxx::__ops::_Iter_comp_iter<boost::_bi::bind_t<bool,boost::_mfi::cmf2<bool,trimesh::dataset_t,int_const&,int_const&>,boost::_bi::list3<boost::_bi::value<trimesh::dataset_t*>,boost::arg<1>,boost::arg<2>>>>>
                         (cf,__last,__comp);
      if (piVar4 != __last) {
        bVar1 = dataset_t::is_boundry(ds,*piVar4);
        bVar2 = dataset_t::is_boundry(ds,(b->super_type).m_iterator);
        if (bVar1 == bVar2) {
          dataset_t::pair(ds,(b->super_type).m_iterator,*piVar4);
        }
      }
    }
    c = (b->super_type).m_iterator + 1;
    (b->super_type).m_iterator = c;
  } while( true );
}

Assistant:

inline void assign_pairs2(dataset_t &ds,Titer b,Titer e)
  {
	const int size = 20;
	cellid_t cf[size],*cfe;

    BOOST_AUTO(cmp,bind(&dataset_t::compare_cells<dim+1>,&ds,_1,_2));

    int np = 0;

    for(;b!=e;++b)
      if(!ds.is_paired(*b))
      {
		uint pos = ds.get_cets<ASC>(*b, cf);
		ENSURES(pos < size)
				  <<"A maximum of 20 cofacets are assumed. Adjust const above!!";
		cfe = cf + pos;
		cfe = filter_elst2(cf,cfe,cf,*b,ds);

        cellid_t *mcf = min_element(cf,cfe,cmp);

        if( mcf != cfe && ds.is_boundry(*mcf) == ds.is_boundry(*b))
        {
          ds.pair(*b,*mcf); np++;
        }
      }
  }